

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.h
# Opt level: O0

Value_BlobFileValue * __thiscall
CoreML::Specification::MILSpec::Value::mutable_blobfilevalue(Value *this)

{
  bool bVar1;
  Value_BlobFileValue *this_00;
  Value *this_local;
  
  bVar1 = has_blobfilevalue(this);
  if (!bVar1) {
    clear_value(this);
    set_has_blobfilevalue(this);
    this_00 = (Value_BlobFileValue *)operator_new(0x28);
    Value_BlobFileValue::Value_BlobFileValue(this_00);
    (this->value_).blobfilevalue_ = this_00;
  }
  return (Value_BlobFileValue *)(this->value_).immediatevalue_;
}

Assistant:

inline ::CoreML::Specification::MILSpec::Value_BlobFileValue* Value::mutable_blobfilevalue() {
  if (!has_blobfilevalue()) {
    clear_value();
    set_has_blobfilevalue();
    value_.blobfilevalue_ = new ::CoreML::Specification::MILSpec::Value_BlobFileValue;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.MILSpec.Value.blobFileValue)
  return value_.blobfilevalue_;
}